

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_settable_totop(lua_State *L,CallInfo *ci,TValue *ra,TValue *first_val,int start)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ulong key;
  lua_Number *data_4;
  lua_Number lStack_b0;
  uint ukey_4;
  lua_Number d;
  lua_Number *data_3;
  uint ukey_3;
  lua_Number *data_2;
  uint ukey_2;
  lua_Integer *data_1;
  lua_Integer lStack_78;
  uint ukey_1;
  lua_Integer i_1;
  lua_Integer *data;
  uint ukey;
  uint u;
  TValue *val_1;
  RaviArray *pRStack_50;
  int i;
  RaviArray *h_1;
  TValue *val;
  Table *h;
  uint local_30;
  int n;
  uint last;
  int start_local;
  TValue *first_val_local;
  TValue *ra_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  h._4_4_ = (int)((long)L->top - (long)first_val >> 4);
  local_30 = (start + h._4_4_) - 1;
  n = start;
  _last = first_val;
  first_val_local = ra;
  ra_local = (TValue *)ci;
  ci_local = (CallInfo *)L;
  if (ra->tt_ == 0x8005) {
    if (ra->tt_ != 0x8005) {
      __assert_fail("((((ra))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb39,
                    "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                   );
    }
    if (((ra->value_).gc)->tt != '\x05') {
      __assert_fail("(((ra)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb39,
                    "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                   );
    }
    val = (TValue *)(ra->value_).gc;
    if (((Table *)val)->sizearray < local_30) {
      luaH_resizearray(L,(Table *)val,local_30);
    }
    for (; 0 < h._4_4_; h._4_4_ = h._4_4_ + -1) {
      h_1 = (RaviArray *)(_last + (long)h._4_4_ + -1);
      key = (ulong)local_30;
      local_30 = local_30 - 1;
      luaH_setint((lua_State *)ci_local,(Table *)val,key,(TValue *)h_1);
      uVar1._0_1_ = h_1->tt;
      uVar1._1_1_ = h_1->marked;
      if ((uVar1 & 0x8000) != 0) {
        if (9 < ((byte)val->tt_ & 0xf)) {
          __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xb3f,
                        "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                       );
        }
        if ((val->tt_ & 0x2000) != 0) {
          uVar2._0_1_ = h_1->tt;
          uVar2._1_1_ = h_1->marked;
          if ((uVar2 & 0x8000) == 0) {
            __assert_fail("(((val)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb3f,
                          "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                         );
          }
          if ((h_1->next->marked & 0x18) != 0) {
            if (9 < ((byte)val->tt_ & 0xf)) {
              __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0xb3f,
                            "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                           );
            }
            luaC_barrierback_((lua_State *)ci_local,(GCObject *)val);
          }
        }
      }
    }
  }
  else {
    if ((ra->tt_ != 0x8015) && (ra->tt_ != 0x8025)) {
      __assert_fail("(((((ra))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((ra))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb43,
                    "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                   );
    }
    if ((((ra->value_).gc)->tt != '\x15') && (((ra->value_).gc)->tt != '%')) {
      __assert_fail("((((ra)->value_).gc)->tt == ((5) | ((1) << 4)) || (((ra)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb43,
                    "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                   );
    }
    pRStack_50 = (RaviArray *)(ra->value_).gc;
    for (val_1._4_4_ = start; (int)val_1._4_4_ <= (int)local_30; val_1._4_4_ = val_1._4_4_ + 1) {
      _ukey = _last + (long)(int)val_1._4_4_ + -1;
      data._4_4_ = val_1._4_4_;
      if ((pRStack_50->flags & 8) == 0) {
        if (_last[(long)(int)val_1._4_4_ + -1].tt_ == 0x13) {
          data._0_4_ = val_1._4_4_;
          i_1 = (lua_Integer)pRStack_50->data;
          if (val_1._4_4_ < pRStack_50->len) {
            if (_last[(long)(int)val_1._4_4_ + -1].tt_ != 0x13) {
              __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0xb4a,
                            "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                           );
            }
            *(Value *)(i_1 + (ulong)val_1._4_4_ * 8) = _ukey->value_;
          }
          else {
            if (_last[(long)(int)val_1._4_4_ + -1].tt_ != 0x13) {
              __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0xb4a,
                            "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                           );
            }
            raviH_set_int((lua_State *)ci_local,pRStack_50,(ulong)val_1._4_4_,(_ukey->value_).i);
          }
        }
        else {
          lStack_78 = 0;
          if (_last[(long)(int)val_1._4_4_ + -1].tt_ == 0x13) {
            if (_last[(long)(int)val_1._4_4_ + -1].tt_ != 0x13) {
              __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0xb4e,
                            "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                           );
            }
            lStack_78 = (_ukey->value_).i;
          }
          else {
            iVar3 = luaV_tointegerns(_ukey,&stack0xffffffffffffff88,F2Ieq);
            if (iVar3 == 0) {
              luaG_runerror((lua_State *)ci_local,"value cannot be converted to integer");
            }
          }
          if (data._4_4_ < pRStack_50->len) {
            *(lua_Integer *)(pRStack_50->data + (ulong)data._4_4_ * 8) = lStack_78;
          }
          else {
            raviH_set_int((lua_State *)ci_local,pRStack_50,(ulong)data._4_4_,lStack_78);
          }
        }
      }
      else if (_last[(long)(int)val_1._4_4_ + -1].tt_ == 3) {
        if (val_1._4_4_ < pRStack_50->len) {
          if (_last[(long)(int)val_1._4_4_ + -1].tt_ != 3) {
            __assert_fail("((((val))->tt_) == (((3) | ((0) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb57,
                          "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                         );
          }
          *(Value *)(pRStack_50->data + (ulong)val_1._4_4_ * 8) = _ukey->value_;
        }
        else {
          if (_last[(long)(int)val_1._4_4_ + -1].tt_ != 3) {
            __assert_fail("((((val))->tt_) == (((3) | ((0) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb57,
                          "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                         );
          }
          raviH_set_float((lua_State *)ci_local,pRStack_50,(ulong)val_1._4_4_,(_ukey->value_).n);
        }
      }
      else if (_last[(long)(int)val_1._4_4_ + -1].tt_ == 0x13) {
        if (val_1._4_4_ < pRStack_50->len) {
          if (_last[(long)(int)val_1._4_4_ + -1].tt_ != 0x13) {
            __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb5a,
                          "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                         );
          }
          *(double *)(pRStack_50->data + (ulong)val_1._4_4_ * 8) = (double)(_ukey->value_).i;
        }
        else {
          if (_last[(long)(int)val_1._4_4_ + -1].tt_ != 0x13) {
            __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb5a,
                          "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                         );
          }
          raviH_set_float((lua_State *)ci_local,pRStack_50,(ulong)val_1._4_4_,
                          (double)(_ukey->value_).i);
        }
      }
      else {
        if (_last[(long)(int)val_1._4_4_ + -1].tt_ == 3) {
          if (_last[(long)(int)val_1._4_4_ + -1].tt_ != 3) {
            __assert_fail("((((val))->tt_) == (((3) | ((0) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb5e,
                          "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                         );
          }
          lStack_b0 = (_ukey->value_).n;
        }
        else {
          if (_last[(long)(int)val_1._4_4_ + -1].tt_ != 0x13) {
            luaG_runerror((lua_State *)ci_local,"value cannot be converted to number");
          }
          if (_last[(long)(int)val_1._4_4_ + -1].tt_ != 0x13) {
            __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb5e,
                          "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                         );
          }
          lStack_b0 = (lua_Number)(_ukey->value_).i;
        }
        if (val_1._4_4_ < pRStack_50->len) {
          *(lua_Number *)(pRStack_50->data + (ulong)val_1._4_4_ * 8) = lStack_b0;
        }
        else {
          raviH_set_float((lua_State *)ci_local,pRStack_50,(ulong)val_1._4_4_,lStack_b0);
        }
      }
    }
  }
  return;
}

Assistant:

void raviV_op_settable_totop(lua_State *L, CallInfo *ci, TValue *ra, TValue *first_val, int start) {
  unsigned int last;
  int n = cast_int(L->top - first_val);
  last = start + n - 1;
  if (ttisLtable(ra)) {
    Table *h = hvalue(ra);
    if (last > h->sizearray)        /* needs more space? */
      luaH_resizearray(L, h, last); /* pre-allocate it at once */
    for (; n > 0; n--) {
      TValue *val = first_val + n - 1;
      luaH_setint(L, h, last--, val);
      luaC_barrierback(L, obj2gco(h), val);
    }
  }
  else {
    RaviArray *h = arrvalue(ra);
    int i = start;
    for (; i <= (int)last; i++) {
      TValue *val = first_val + i - 1;
      unsigned int u = (unsigned int)(i);
      if ((h->flags & RAVI_ARRAY_ISFLOAT) == 0) {
        if (ttisinteger(val)) {
          raviH_set_int_inline(L, h, u, ivalue(val));
        }
        else {
          lua_Integer i = 0;
          if (tointegerns(val, &i)) {
            raviH_set_int_inline(L, h, u, i);
          }
          else
            luaG_runerror(L, "value cannot be converted to integer");
        }
      }
      else {
        if (ttisfloat(val)) {
          raviH_set_float_inline(L, h, u, fltvalue(val));
        }
        else if (ttisinteger(val)) {
          raviH_set_float_inline(L, h, u, (lua_Number)(ivalue(val)));
        }
        else {
          lua_Number d = 0.0;
          if (tonumberns(val, d)) {
            raviH_set_float_inline(L, h, u, d);
          }
          else
            luaG_runerror(L, "value cannot be converted to number");
        }
      }
    }
  }
  //L->top = ci->top; /* correct top (in case of previous open call) */
}